

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O0

bool suppressedById(char *id)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *idPos;
  char *commentToCheck;
  size_t idLength;
  char *id_local;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/io_err.cpp"
                  ,0x17b,"bool suppressedById(const char *)");
  }
  if (eolComment == (char *)0x0) {
    id_local._7_1_ = false;
  }
  else {
    sVar2 = strlen(id);
    if (sVar2 == 0) {
      __assert_fail("0 < idLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/io_err.cpp"
                    ,0x17e,"bool suppressedById(const char *)");
    }
    idPos = eolComment;
    do {
      pcVar3 = strstr(idPos,id);
      if (pcVar3 == (char *)0x0) {
        return false;
      }
      iVar1 = strcmp(id,W_FAKE);
      if (iVar1 == 0) {
        return true;
      }
      idPos = pcVar3 + sVar2;
    } while (((*idPos != '-') || (idPos[1] != 'o')) || (idPos[2] != 'k'));
    id_local._7_1_ = true;
  }
  return id_local._7_1_;
}

Assistant:

bool suppressedById(const char* id) {
	assert(id);
	if (nullptr == eolComment) return false;
	const size_t idLength = strlen(id);
	assert(0 < idLength);
	const char* commentToCheck = eolComment;
	while (const char* idPos = strstr(commentToCheck, id)) {
		if (!strcmp(id, W_FAKE)) return true;				// "fake" only is enough to suppress those
		commentToCheck = idPos + idLength;
		if ('-' == commentToCheck[0] && 'o' == commentToCheck[1] && 'k' == commentToCheck[2]) {
			return true;
		}
	}
	return false;
}